

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

void __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::setMemorySize
          (ModuleRunnerBase<wasm::ModuleRunner> *this,Name memory,Address size)

{
  iterator iVar1;
  mapped_type *pmVar2;
  undefined1 local_30 [8];
  Name memory_local;
  
  memory_local.super_IString.str._M_len = memory.super_IString.str._M_str;
  local_30 = memory.super_IString.str._M_len;
  iVar1 = std::
          _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Address>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->memorySizes)._M_h,(key_type *)local_30);
  if (iVar1.super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Address>,_true>._M_cur ==
      (__node_type *)0x0) {
    (*this->externalInterface->_vptr_ExternalInterface[8])
              (this->externalInterface,"setMemorySize called on non-existing memory");
  }
  pmVar2 = std::__detail::
           _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Address>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Address>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->memorySizes,(key_type *)local_30);
  pmVar2->addr = size.addr;
  return;
}

Assistant:

void setMemorySize(Name memory, Address size) {
    auto iter = memorySizes.find(memory);
    if (iter == memorySizes.end()) {
      externalInterface->trap("setMemorySize called on non-existing memory");
    }
    memorySizes[memory] = size;
  }